

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::StrictEqualString(Var aLeft,JavascriptString *aRight)

{
  bool bVar1;
  undefined8 local_38;
  JavascriptString *leftStr;
  JavascriptString *aRight_local;
  Var aLeft_local;
  
  bVar1 = VarIs<Js::JavascriptString>(aLeft);
  if (bVar1) {
    local_38 = UnsafeVarTo<Js::JavascriptString>(aLeft);
  }
  else {
    local_38 = (JavascriptString *)0x0;
  }
  if (local_38 == (JavascriptString *)0x0) {
    aLeft_local._4_4_ = 0;
  }
  else {
    bVar1 = JavascriptString::Equals(local_38,aRight);
    aLeft_local._4_4_ = (uint)bVar1;
  }
  return aLeft_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::StrictEqualString(Var aLeft, JavascriptString* aRight)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqualString);
        JIT_HELPER_SAME_ATTRIBUTES(Op_StrictEqualString, Op_StrictEqual);

        JavascriptString* leftStr = TryFromVar<JavascriptString>(aLeft);
        if (!leftStr)
        {
            return false;
        }
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqualString);
        JIT_HELPER_SAME_ATTRIBUTES(Op_StrictEqualString, Op_StrictEqual);
        return JavascriptString::Equals(leftStr, aRight);
        JIT_HELPER_END(Op_StrictEqualString);
    }